

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::ReleaseMessage
          (ExtensionSet *this,int number,MessageLite *prototype)

{
  Extension *pEVar1;
  undefined8 in_RDX;
  long *in_RDI;
  MessageLite *ret;
  Extension *extension;
  int in_stack_ffffffffffffff24;
  undefined4 in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  ExtensionSet *in_stack_ffffffffffffff30;
  MessageLite *local_c0;
  MessageLite *local_8;
  
  pEVar1 = FindOrNull((ExtensionSet *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                      in_stack_ffffffffffffff24);
  if (pEVar1 == (Extension *)0x0) {
    local_8 = (MessageLite *)0x0;
  }
  else {
    if (((byte)pEVar1->field_0xa >> 4 & 1) == 0) {
      if (*in_RDI == 0) {
        local_c0 = (MessageLite *)(pEVar1->field_0).int64_value;
      }
      else {
        local_c0 = (MessageLite *)
                   (*(code *)(((((pEVar1->field_0).repeated_string_value)->
                               super_RepeatedPtrFieldBase).arena_)->impl_).initial_block_)();
        (*local_c0->_vptr_MessageLite[10])(local_c0,(pEVar1->field_0).int64_value);
      }
    }
    else {
      local_c0 = (MessageLite *)
                 (*(code *)(((((pEVar1->field_0).repeated_string_value)->super_RepeatedPtrFieldBase)
                            .arena_)->impl_).options_.initial_block)
                           ((pEVar1->field_0).repeated_string_value,in_RDX);
      if ((*in_RDI == 0) &&
         ((pEVar1->field_0).repeated_string_value !=
          (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)0x0)) {
        (*(code *)(((((pEVar1->field_0).repeated_string_value)->super_RepeatedPtrFieldBase).arena_)
                  ->impl_).hint_._M_b._M_p)();
      }
    }
    Erase(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
    local_8 = local_c0;
  }
  return local_8;
}

Assistant:

MessageLite* ExtensionSet::ReleaseMessage(int number,
                                          const MessageLite& prototype) {
  Extension* extension = FindOrNull(number);
  if (extension == NULL) {
    // Not present.  Return NULL.
    return NULL;
  } else {
    GOOGLE_DCHECK_TYPE(*extension, OPTIONAL_FIELD, MESSAGE);
    MessageLite* ret = NULL;
    if (extension->is_lazy) {
      ret = extension->lazymessage_value->ReleaseMessage(prototype);
      if (arena_ == NULL) {
        delete extension->lazymessage_value;
      }
    } else {
      if (arena_ == NULL) {
        ret = extension->message_value;
      } else {
        // ReleaseMessage() always returns a heap-allocated message, and we are
        // on an arena, so we need to make a copy of this message to return.
        ret = extension->message_value->New();
        ret->CheckTypeAndMergeFrom(*extension->message_value);
      }
    }
    Erase(number);
    return ret;
  }
}